

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

float cnn::logsumexp<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
                (Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> *x)

{
  Scalar SVar1;
  double dVar2;
  float z;
  float m;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  const_add_op<float> in_stack_ffffffffffffff2c;
  ArrayBase<Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
  local_80 [112];
  Scalar local_10;
  Scalar local_c;
  
  local_c = Eigen::
            DenseBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>
            ::maxCoeff((DenseBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                        *)0x3d743c);
  SVar1 = -local_c;
  dVar2 = (double)(ulong)(uint)SVar1;
  const_add_op<float>::const_add_op
            ((const_add_op<float> *)&stack0xffffffffffffff2c,(float *)&stack0xffffffffffffff28);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>>::
  unaryExpr<cnn::const_add_op<float>>
            ((DenseBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
              *)CONCAT44(in_stack_ffffffffffffff2c.c,SVar1),
             (const_add_op<float> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>_>
  ::array((MatrixBase<Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
           *)CONCAT44(in_stack_ffffffffffffff2c.c,SVar1));
  Eigen::
  ArrayBase<Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
  ::exp(local_80,dVar2);
  Eigen::
  ArrayBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>
  ::matrix((ArrayBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>
            *)CONCAT44(in_stack_ffffffffffffff2c.c,SVar1));
  local_10 = Eigen::
             DenseBase<Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>_>
             ::sum((DenseBase<Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>_>
                    *)CONCAT44(in_stack_ffffffffffffff2c.c,SVar1));
  dVar2 = std::log((double)(ulong)(uint)local_10);
  return local_c + SUB84(dVar2,0);
}

Assistant:

EIGEN_STRONG_INLINE float logsumexp(const T& x) {
  using std::exp;
  using std::log;
  const float m = x.maxCoeff();
#if 1
  // these are equivalent, but this can use vectorized arithmetic
  float z = x.unaryExpr(const_add_op<float>(-m)).array().exp().matrix().sum();
#else
  float z = 0;
  for (unsigned i = 0; i < x.rows(); ++i)
    z += exp(x(i,0) - m);
#endif
  return m + log(z);
}